

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall HModel::util_getBasicIndices(HModel *this,int *bind)

{
  uint uVar1;
  pointer piVar2;
  int row;
  long lVar3;
  uint uVar4;
  
  piVar2 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 < this->numRow; lVar3 = lVar3 + 1) {
    uVar1 = piVar2[lVar3];
    uVar4 = ~uVar1 + this->numCol;
    if ((int)uVar1 < this->numCol) {
      uVar4 = uVar1;
    }
    bind[lVar3] = uVar4;
  }
  return 0;
}

Assistant:

int HModel::util_getBasicIndices(int* bind) {
  for (int row = 0; row < numRow; row++) {
    int var = basicIndex[row];
    if (var >= numCol)
      bind[row] = -(1+var-numCol);
    else
      bind[row] = var;
  }
  return 0;
}